

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

NodeBase **
google::protobuf::Arena::CreateArray<google::protobuf::internal::NodeBase*>
          (Arena *arena,size_t num_elements)

{
  undefined1 auVar1 [16];
  unsigned_long uVar2;
  char *failure_msg;
  LogMessage *pLVar3;
  ulong uVar4;
  LogMessage local_50;
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t num_elements_local;
  Arena *arena_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)num_elements;
  num_elements_local = (size_t)arena;
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(num_elements);
  uVar2 = std::numeric_limits<unsigned_long>::max();
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar2 >> 3);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,
                        "num_elements <= std::numeric_limits<size_t>::max() / sizeof(T)");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.h"
               ,0x109,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [48])"Requested size is too large to fit into size_t.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if (num_elements_local == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = absl_log_internal_check_op_result;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    arena_local = (Arena *)operator_new__(uVar4);
  }
  else {
    arena_local = (Arena *)AllocateAlignedForArray
                                     ((Arena *)num_elements_local,
                                      (long)absl_log_internal_check_op_result << 3,8);
  }
  return (NodeBase **)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArray(Arena* PROTOBUF_NULLABLE arena, size_t num_elements) {
    static_assert(std::is_trivial<T>::value,
                  "CreateArray requires a trivially constructible type");
    static_assert(std::is_trivially_destructible<T>::value,
                  "CreateArray requires a trivially destructible type");
    ABSL_CHECK_LE(num_elements, std::numeric_limits<size_t>::max() / sizeof(T))
        << "Requested size is too large to fit into size_t.";
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      return new T[num_elements];
    } else {
      // We count on compiler to realize that if sizeof(T) is a multiple of
      // 8 AlignUpTo can be elided.
      return static_cast<T*>(
          arena->AllocateAlignedForArray(sizeof(T) * num_elements, alignof(T)));
    }
  }